

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int gmfgetblockf77_(int64_t *MshIdx,int *KwdCod,int *BegIdx,int *EndIdx,int *MapTyp,int *MatTab,
                   int *BegInt,int *EndInt,double *BegDbl,double *EndDbl,int *BegRef,int *EndRef)

{
  char cVar1;
  int KwdCod_00;
  int iVar2;
  long MshIdx_00;
  int iVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  int SizTab [1000];
  int TypTab [1000];
  char *BegTab [1000];
  char *EndTab [1000];
  
  MshIdx_00 = *MshIdx;
  KwdCod_00 = *KwdCod;
  lVar5 = (long)KwdCod_00 * 0x3300;
  iVar2 = *(int *)(MshIdx_00 + 0x11c + lVar5);
  iVar3 = 0;
  if ((long)iVar2 < 1000) {
    if (0 < iVar2) {
      uVar4 = 0;
      do {
        cVar1 = *(char *)(MshIdx_00 + lVar5 + 0x10e8 + uVar4);
        if (cVar1 == 'r') {
          TypTab[uVar4] = 9;
          SizTab[uVar4] = 1;
          BegTab[uVar4] = (char *)BegDbl;
          pdVar6 = EndDbl;
LAB_0010b0a9:
          EndTab[uVar4] = (char *)pdVar6;
        }
        else if (cVar1 == 'i') {
          TypTab[uVar4] = 10;
          SizTab[uVar4] = 1;
          if ((""[KwdCod_00] == '\0') || (iVar2 - 1 != uVar4)) {
            BegTab[uVar4] = (char *)BegInt;
            pdVar6 = (double *)(EndInt + uVar4);
          }
          else {
            BegTab[uVar4] = (char *)BegRef;
            pdVar6 = (double *)EndRef;
          }
          goto LAB_0010b0a9;
        }
        uVar4 = uVar4 + 1;
        EndDbl = EndDbl + 1;
        BegDbl = BegDbl + 1;
        BegInt = BegInt + 1;
      } while (uVar4 < (ulong)(long)iVar2);
    }
    iVar3 = GmfGetBlock(MshIdx_00,KwdCod_00,(long)*BegIdx,(long)*EndIdx,*MapTyp,MatTab,(void *)0x0,
                        100,TypTab,SizTab,BegTab,EndTab);
  }
  return iVar3;
}

Assistant:

int APIF77(gmfgetblockf77)(int64_t *MshIdx, int *KwdCod,
                           int *BegIdx, int *EndIdx,
                           int *MapTyp, int *MatTab,
                           int *BegInt, int *EndInt,
                           double *BegDbl, double *EndDbl,
                           int *BegRef, int *EndRef)
{
   int         i, TypTab[ MaxArg ], SizTab[ MaxArg ];
   char        *BegTab[ MaxArg ], *EndTab[ MaxArg ];
   GmfMshSct   *msh = (GmfMshSct *)*MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ *KwdCod ];

   // Fortran mode will expand all fields as a separate scalar so we need space
   if(kwd->SolSiz >= MaxArg)
      return(0);

   // Fortran call to getblock uses the GmfArgTab mode where pointers are passed
   // through tables: types[], vec sizes[], begin pointers[] and end pointers[]
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'i')
      {
         TypTab[i] = GmfInt;
         SizTab[i] = 1;

         if( (F77RefFlg[ *KwdCod ]) && (i == kwd->SolSiz-1) )
         {
            BegTab[i] = (char *)BegRef;
            EndTab[i] = (char *)EndRef;
         }
         else
         {
            BegTab[i] = (char *)&BegInt[i];
            EndTab[i] = (char *)&EndInt[i];
         }
      }else if(kwd->fmt[i] == 'r')
      {
         TypTab[i] = GmfDouble;
         SizTab[i] = 1;
         BegTab[i] = (char *)&BegDbl[i];
         EndTab[i] = (char *)&EndDbl[i];
      }
   }

   return(GmfGetBlock(  *MshIdx, *KwdCod, *BegIdx, *EndIdx, *MapTyp, MatTab,
                        NULL, GmfArgTab, TypTab, SizTab, BegTab, EndTab ));
}